

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O2

_Bool check_mat_mul(ggml_tensor *y,ggml_tensor *x0,ggml_tensor *x1)

{
  int64_t iVar1;
  int64_t iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int i3;
  long lVar7;
  long lVar8;
  int i;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int k;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int i_1;
  int i2;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  undefined1 auVar19 [64];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 extraout_var [60];
  
  lVar8 = x0->ne[0];
  lVar13 = x0->ne[1];
  lVar10 = x1->ne[0];
  lVar7 = x1->ne[1];
  iVar1 = x1->ne[2];
  iVar2 = x1->ne[3];
  uVar5 = y->ne[0];
  uVar16 = y->ne[1];
  uVar3 = y->ne[2];
  uVar4 = y->ne[3];
  lVar12 = 0;
  printf("x0: [%ld, %ld, %ld, %ld]\n",lVar8,lVar13,x0->ne[2],x0->ne[3]);
  if (lVar8 < 1) {
    lVar8 = lVar12;
  }
  if (lVar13 < 1) {
    lVar13 = lVar12;
  }
  for (; lVar12 != lVar13; lVar12 = lVar12 + 1) {
    for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
      printf("%6.3f ",(double)*(float *)((long)x0->data + x0->nb[1] * lVar12 + x0->nb[0] * lVar9));
    }
    putchar(10);
  }
  putchar(10);
  lVar13 = 0;
  printf("x1: [%ld, %ld, %ld, %ld]\n",lVar10,lVar7,iVar1,iVar2);
  if (lVar10 < 1) {
    lVar10 = lVar13;
  }
  if (lVar7 < 1) {
    lVar7 = lVar13;
  }
  for (; lVar13 != lVar7; lVar13 = lVar13 + 1) {
    for (lVar12 = 0; lVar10 != lVar12; lVar12 = lVar12 + 1) {
      printf("%6.3f ",(double)*(float *)((long)x1->data + x1->nb[1] * lVar13 + x1->nb[0] * lVar12));
    }
    putchar(10);
  }
  putchar(10);
  uVar14 = 0;
  printf("y: [%ld, %ld, %ld, %ld]\n",uVar5,uVar16,uVar3,uVar4);
  if ((long)uVar5 < 1) {
    uVar5 = uVar14;
  }
  if ((long)uVar16 < 1) {
    uVar16 = uVar14;
  }
  for (; uVar14 != uVar16; uVar14 = uVar14 + 1) {
    for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
      printf("%6.3f ",(double)*(float *)((long)y->data + y->nb[1] * uVar14 + y->nb[0] * uVar17));
    }
    putchar(10);
  }
  uVar14 = 0;
  if ((long)uVar3 < 1) {
    uVar3 = uVar14;
  }
  if ((long)uVar4 < 1) {
    uVar4 = uVar14;
  }
  do {
    if (uVar14 == uVar4) {
      return true;
    }
    for (uVar17 = 0; uVar17 != uVar3; uVar17 = uVar17 + 1) {
      for (uVar11 = 0; uVar11 != uVar16; uVar11 = uVar11 + 1) {
        uVar6 = 0;
        while (uVar6 != uVar5) {
          auVar21 = ZEXT816(0) << 0x40;
          lVar13 = 0;
          while( true ) {
            fVar20 = auVar21._0_4_;
            i2 = (int)uVar17;
            i3 = (int)uVar14;
            if (lVar8 == lVar13) break;
            fVar18 = mat_get(x0,(int)lVar13,(int)uVar6,i2,i3);
            auVar19._0_4_ = mat_get(x1,(int)lVar13,(int)uVar11,i2,i3);
            auVar19._4_60_ = extraout_var;
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)fVar20),auVar19._0_16_,ZEXT416((uint)fVar18));
            lVar13 = lVar13 + 1;
          }
          uVar15 = uVar6 & 0xffffffff;
          fVar18 = mat_get(y,(int)uVar6,(int)uVar11,i2,i3);
          auVar21._8_4_ = 0x7fffffff;
          auVar21._0_8_ = 0x7fffffff7fffffff;
          auVar21._12_4_ = 0x7fffffff;
          auVar21 = vandps_avx(ZEXT416((uint)(fVar20 - fVar18)),auVar21);
          uVar6 = uVar6 + 1;
          if (1e-05 < auVar21._0_4_) {
            printf("error: i0=%d, i1=%d, i2=%d, i3=%d, sum=%f, y=%f\n",(double)fVar20,(double)fVar18
                   ,uVar15,uVar11 & 0xffffffff,uVar17 & 0xffffffff,uVar14 & 0xffffffff);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                          ,0xdc,
                          "_Bool check_mat_mul(const struct ggml_tensor *, const struct ggml_tensor *, const struct ggml_tensor *)"
                         );
          }
        }
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

bool check_mat_mul(
        const struct ggml_tensor * y,
        const struct ggml_tensor * x0,
        const struct ggml_tensor * x1) {
    const int64_t n00 = x0->ne[0];
    const int64_t n10 = x0->ne[1];
    const int64_t n20 = x0->ne[2];
    const int64_t n30 = x0->ne[3];

    const int64_t n01 = x1->ne[0];
    const int64_t n11 = x1->ne[1];
    const int64_t n21 = x1->ne[2];
    const int64_t n31 = x1->ne[3];

    const int64_t n02 = y->ne[0];
    const int64_t n12 = y->ne[1];
    const int64_t n22 = y->ne[2];
    const int64_t n32 = y->ne[3];

    printf("x0: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n00, n10, n20, n30);
    for (int j = 0; j < n10; ++j) {
        for (int i = 0; i < n00; ++i) {
            printf("%6.3f ", mat_get(x0, i, j, 0, 0));
        }
        printf("\n");
    }
    printf("\n");

    printf("x1: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n01, n11, n21, n31);
    for (int j = 0; j < n11; ++j) {
        for (int i = 0; i < n01; ++i) {
            printf("%6.3f ", mat_get(x1, i, j, 0, 0));
        }
        printf("\n");
    }
    printf("\n");

    printf("y: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n02, n12, n22, n32);
    for (int j = 0; j < n12; ++j) {
        for (int i = 0; i < n02; ++i) {
            printf("%6.3f ", mat_get(y, i, j, 0, 0));
        }
        printf("\n");
    }

    for (int i3 = 0; i3 < n32; ++i3) {
        for (int i2 = 0; i2 < n22; ++i2) {
            for (int i1 = 0; i1 < n12; ++i1) {
                for (int i0 = 0; i0 < n02; ++i0) {
                    float sum = 0.0f;
                    for (int k = 0; k < n00; ++k) {
                        sum += mat_get(x0, k, i0, i2, i3) * mat_get(x1, k, i1, i2, i3);
                    }
                    if (fabsf(sum - mat_get(y, i0, i1, i2, i3)) > 1e-5) {
                        printf("error: i0=%d, i1=%d, i2=%d, i3=%d, sum=%f, y=%f\n",
                                i0, i1, i2, i3, sum, mat_get(y, i0, i1, i2, i3));
                        assert(false);
                        return false;
                    }
                }
            }
        }
    }

    return true;
}